

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O3

void __thiscall Grid::Grid(Grid *this,s_i raw,int sep,int just,int fill,bool *empty)

{
  cg_box *this_00;
  int *piVar1;
  cg_other *pcVar2;
  
  this->SLIMEBIT_SHIFT = 0x1e;
  this->SLIMEBIT = 0x40000000;
  this_00 = (cg_box *)operator_new(0x10);
  cg_box::cg_box(this_00,raw,sep,just,fill,empty);
  (this->box).ptr = this_00;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 1;
  (this->box).count = piVar1;
  pcVar2 = (cg_other *)operator_new(0x18);
  (pcVar2->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar2->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar2->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->other).ptr = pcVar2;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 1;
  (this->other).count = piVar1;
  return;
}

Assistant:

Grid::Grid(s_i raw, int sep, int just, int fill, bool &empty):
        box(new cg_box(raw,sep,just,fill,empty)),
        other(new cg_other) { }